

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP4Deserializer::ParseVariablesIndexPerStep
          (BP4Deserializer *this,BufferSTL *bufferSTL,Engine *engine,size_t submetadatafileId,
          size_t step)

{
  vector<char,_std::allocator<char>_> *buffer;
  unsigned_long uVar1;
  size_t step_00;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t local_d0;
  Engine *local_c8;
  ulong local_c0;
  size_t local_b8;
  size_t local_b0;
  ElementIndexHeader local_a8;
  
  buffer = &bufferSTL->m_Buffer;
  local_c8 = engine;
  local_b8 = step;
  local_b0 = submetadatafileId;
  this_00 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)(this->_vptr_BP4Deserializer[-3] +
                               (long)&(this->m_Minifooter).VersionTag),&local_b0);
  pmVar2 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this_00,&local_b8);
  uVar1 = (pmVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[1];
  local_c0 = *(ulong *)((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar1 + 4);
  sVar4 = uVar1 + 0xc;
  uVar3 = 0;
  sVar5 = sVar4;
  while (step_00 = local_b8, uVar3 < local_c0) {
    local_d0 = sVar5;
    BP4Base::ReadElementIndexHeader
              (&local_a8,
               (BP4Base *)
               ((long)&this->_vptr_BP4Deserializer + (long)this->_vptr_BP4Deserializer[-3]),buffer,
               &local_d0,(this->m_Minifooter).IsLittleEndian);
    switch(local_a8.DataType) {
    case '\0':
      DefineVariableInEngineIOPerStep<signed_char>(this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    case '\x01':
      DefineVariableInEngineIOPerStep<short>(this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    case '\x02':
      DefineVariableInEngineIOPerStep<int>(this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    case '\x03':
    case '\b':
      break;
    case '\x04':
      DefineVariableInEngineIOPerStep<long>(this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    case '\x05':
      DefineVariableInEngineIOPerStep<float>(this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    case '\x06':
      DefineVariableInEngineIOPerStep<double>(this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    case '\a':
      DefineVariableInEngineIOPerStep<long_double>(this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    case '\t':
      DefineVariableInEngineIOPerStep<std::__cxx11::string>
                (this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    case '\n':
      DefineVariableInEngineIOPerStep<std::complex<float>>
                (this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    case '\v':
      DefineVariableInEngineIOPerStep<std::complex<double>>
                (this,&local_a8,local_c8,buffer,local_d0,step_00);
      break;
    default:
      switch(local_a8.DataType) {
      case '2':
        DefineVariableInEngineIOPerStep<unsigned_char>
                  (this,&local_a8,local_c8,buffer,local_d0,step_00);
        break;
      case '3':
        DefineVariableInEngineIOPerStep<unsigned_short>
                  (this,&local_a8,local_c8,buffer,local_d0,step_00);
        break;
      case '4':
        DefineVariableInEngineIOPerStep<unsigned_int>
                  (this,&local_a8,local_c8,buffer,local_d0,step_00);
        break;
      case '6':
        DefineVariableInEngineIOPerStep<unsigned_long>
                  (this,&local_a8,local_c8,buffer,local_d0,step_00);
        break;
      case '7':
        DefineVariableInEngineIOPerStep<char>(this,&local_a8,local_c8,buffer,local_d0,step_00);
      }
    }
    BPBase::ElementIndexHeader::~ElementIndexHeader(&local_a8);
    sVar5 = sVar5 + *(uint *)((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_start + sVar5) + 4;
    uVar3 = sVar5 - sVar4;
  }
  return;
}

Assistant:

void BP4Deserializer::ParseVariablesIndexPerStep(const BufferSTL &bufferSTL, core::Engine &engine,
                                                 size_t submetadatafileId, size_t step)
{
    auto lf_ReadElementIndexPerStep = [&](core::Engine &engine, const std::vector<char> &buffer,
                                          size_t position, size_t step) {
        const ElementIndexHeader header =
            ReadElementIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);

        switch (header.DataType)
        {

#define make_case(T)                                                                               \
    case (TypeTraits<T>::type_enum): {                                                             \
        DefineVariableInEngineIOPerStep<T>(header, engine, buffer, position, step);                \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(make_case)
#undef make_case

        } // end switch
    };

    const auto &buffer = bufferSTL.m_Buffer;
    size_t position = m_MetadataIndexTable[submetadatafileId][step][1];

    helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian);
    const uint64_t length =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    const size_t startPosition = position;
    size_t localPosition = 0;

    /* FIXME: multi-threaded processing does not work here
     * because DefineVariable may be called from several threads
     */
    /*if (m_Threads == 1)*/
    {
        while (localPosition < length)
        {
            lf_ReadElementIndexPerStep(engine, buffer, position, step);

            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;
        }
        return;
    }
    /*
        // threads for reading Variables
        std::vector<std::future<void>> asyncs(m_Threads);
        std::vector<size_t> asyncPositions(m_Threads);

        bool launched = false;

        while (localPosition < length)
        {
            // extract async positions
            for (unsigned int t = 0; t < m_Threads; ++t)
            {
                asyncPositions[t] = position;
                const size_t elementIndexSize =
                    static_cast<size_t>(helper::ReadValue<uint32_t>(
                        buffer, position, m_Minifooter.IsLittleEndian));
                position += elementIndexSize;
                localPosition = position - startPosition;

                if (launched)
                {
                    asyncs[t].get();
                }

                if (localPosition <= length)
                {
                    asyncs[t] =
                        std::async(std::launch::async,
       lf_ReadElementIndexPerStep, std::ref(engine), std::ref(buffer),
                                   asyncPositions[t], step);
                }
            }
            launched = true;
        }

        for (auto &async : asyncs)
        {
            if (async.valid())
            {
                async.wait();
            }
        }
    */
}